

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O2

Fad<long_double> * __thiscall
TPZMatrix<Fad<long_double>_>::Get
          (Fad<long_double> *__return_storage_ptr__,TPZMatrix<Fad<long_double>_> *this,int64_t row,
          int64_t col)

{
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])();
  return __return_storage_ptr__;
}

Assistant:

inline const TVar TPZMatrix<TVar>::Get(const int64_t row, const int64_t col ) const {
	// bound checking
#ifdef PZDEBUG
	if ( (row >= Rows()) || (col >= Cols()) || row <0 || col <0 ) {
		Error("TPZMatrix::Get", "Index out of range");
        DebugStop();
	}
#endif
	return( GetVal( row, col ) );
}